

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-memchunk.c
# Opt level: O0

void test_alloc_small(void)

{
  int iVar1;
  void *__s;
  int i;
  void *ptr;
  void *prev_ptr;
  MEMCHUNK chunk;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar2;
  void *size;
  MEMCHUNK *chunk_00;
  
  chunk_00 = (MEMCHUNK *)0x0;
  uVar2 = 0;
  size = (void *)0x0;
  while( true ) {
    if (9 < (int)uVar2) {
      memchunk_fini((MEMCHUNK *)CONCAT44(uVar2,in_stack_ffffffffffffffd0));
      return;
    }
    __s = memchunk_alloc(chunk_00,(size_t)size);
    iVar1 = acutest_check_((int)(ulong)(__s != (void *)0x0),
                           "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-memchunk.c"
                           ,0x2b,"%s","ptr != NULL");
    if (iVar1 == 0) break;
    if (size != (void *)0x0) {
      acutest_check_((int)(ulong)((long)__s - (long)size == 0xc),
                     "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-memchunk.c"
                     ,0x2d,"%s","(uintptr_t) ptr - (uintptr_t) prev_ptr == 12");
    }
    memset(__s,uVar2 & 0xff,0xc);
    uVar2 = uVar2 + 1;
    size = __s;
  }
  acutest_abort_();
}

Assistant:

static void
test_alloc_small(void)
{
    MEMCHUNK chunk = MEMCHUNK_INITIALIZER(0);
    void* prev_ptr = NULL;
    void* ptr;
    int i;

    for(i = 0; i < 10; i++) {
        ptr = memchunk_alloc(&chunk, 12);
        TEST_ASSERT(ptr != NULL);
        if(prev_ptr != NULL)
            TEST_CHECK((uintptr_t) ptr - (uintptr_t) prev_ptr == 12);
        memset(ptr, i, 12);
        prev_ptr = ptr;
    }

    memchunk_fini(&chunk);
}